

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

string * __thiscall
boost::deflate::inflate_stream_test::corpus1_abi_cxx11_
          (string *__return_storage_ptr__,inflate_stream_test *this,size_t n)

{
  int iVar1;
  long lVar2;
  inflate_stream_test *piVar3;
  char *pcVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_13f8;
  undefined8 local_13f0;
  char local_13e1;
  result_type rStack_13e0;
  value_type ch;
  result_type rep;
  uniform_int_distribution<unsigned_long> d1;
  uniform_int_distribution<unsigned_long> d0;
  mt19937 g;
  allocator<char> local_19;
  inflate_stream_test *local_18;
  size_t n_local;
  string *s;
  
  local_18 = this;
  n_local = (size_t)__return_storage_ptr__;
  if ((corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_,
               "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz",&local_19);
    std::allocator<char>::~allocator(&local_19);
    __cxa_atexit(std::__cxx11::string::~string,
                 &corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&d0._M_param._M_b);
  lVar2 = std::__cxx11::string::size();
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&d1._M_param._M_b,0,lVar2 - 1);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&rep,1,5);
  while (piVar3 = (inflate_stream_test *)std::__cxx11::string::size(), piVar3 < local_18) {
    rStack_13e0 = std::uniform_int_distribution<unsigned_long>::operator()
                            ((uniform_int_distribution<unsigned_long> *)&rep,
                             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)&d0._M_param._M_b);
    std::uniform_int_distribution<unsigned_long>::operator()
              ((uniform_int_distribution<unsigned_long> *)&d1._M_param._M_b,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)&d0._M_param._M_b);
    pcVar4 = (char *)std::__cxx11::string::operator[](0x14c448);
    local_13e1 = *pcVar4;
    local_13f8._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_13f0,&local_13f8);
    std::__cxx11::string::insert(__return_storage_ptr__,local_13f0,rStack_13e0,(int)local_13e1);
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static
    std::string corpus1(std::size_t n)
    {
        static std::string const alphabet{
            "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
        };
        std::string s;
        s.reserve(n + 5);
        std::mt19937 g;
        std::uniform_int_distribution<std::size_t> d0{
            0, alphabet.size() - 1};
        std::uniform_int_distribution<std::size_t> d1{
            1, 5};
        while(s.size() < n)
        {
            auto const rep = d1(g);
            auto const ch = alphabet[d0(g)];
            s.insert(s.end(), rep, ch);
        }
        s.resize(n);
        return s;
    }